

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PInt::ReadValue(PInt *this,FArchive *ar,void *addr)

{
  undefined8 local_40;
  BYTE val8;
  byte local_31;
  ulong uStack_30;
  BYTE tag;
  QWORD uval;
  void *addr_local;
  FArchive *ar_local;
  PInt *this_local;
  
  uval = (QWORD)addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,&local_31);
  switch(local_31) {
  case 0:
    FArchive::operator<<((FArchive *)addr_local,(BYTE *)&local_40);
    uStack_30 = (ulong)(char)(byte)local_40;
    break;
  case 1:
    FArchive::operator<<((FArchive *)addr_local,(BYTE *)&local_40);
    uStack_30 = (ulong)(byte)local_40;
    break;
  case 2:
    FArchive::operator<<((FArchive *)addr_local,(WORD *)&local_40);
    uStack_30 = (ulong)CONCAT11(local_40._1_1_,(byte)local_40);
    break;
  case 3:
    FArchive::operator<<((FArchive *)addr_local,(WORD *)&local_40);
    uStack_30 = (ulong)CONCAT11(local_40._1_1_,(byte)local_40);
    break;
  case 4:
    FArchive::operator<<((FArchive *)addr_local,(DWORD *)&local_40);
    uStack_30 = (ulong)CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40));
    break;
  case 5:
    FArchive::operator<<((FArchive *)addr_local,(DWORD *)&local_40);
    uStack_30 = (ulong)CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40));
    break;
  case 6:
    FArchive::operator<<((FArchive *)addr_local,(SQWORD *)&stack0xffffffffffffffd0);
    break;
  case 7:
    FArchive::operator<<((FArchive *)addr_local,&stack0xffffffffffffffd0);
    break;
  case 8:
    uStack_30 = 0;
    break;
  case 9:
    uStack_30 = 1;
    break;
  case 10:
    FArchive::operator<<((FArchive *)addr_local,(float *)&local_40);
    uStack_30 = (ulong)(float)CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40));
    break;
  case 0xb:
    FArchive::operator<<((FArchive *)addr_local,(double *)&local_40);
    uStack_30 = (ulong)(double)CONCAT44(local_40._4_4_,
                                        CONCAT22(local_40._2_2_,
                                                 CONCAT11(local_40._1_1_,(byte)local_40)));
    break;
  default:
    PType::SkipValue((FArchive *)addr_local,(uint)local_31);
    return false;
  }
  switch(*(undefined4 *)&this->field_0x24) {
  case 1:
    *(char *)uval = (char)uStack_30;
    break;
  case 2:
    *(short *)uval = (short)uStack_30;
    break;
  case 4:
    *(int *)uval = (int)uStack_30;
    break;
  case 8:
    *(ulong *)uval = uStack_30;
  }
  return true;
}

Assistant:

bool PInt::ReadValue(FArchive &ar, void *addr) const
{
	union
	{
		QWORD uval;
		SQWORD sval;
	};
	BYTE tag;
	union
	{
		BYTE val8;
		WORD val16;
		DWORD val32;
		float single;
		double dbl;
	};

	ar << tag;
	switch (tag)
	{
	case VAL_Zero:		uval = 0; break;
	case VAL_One:		uval = 1; break;
	case VAL_Int8:		ar << val8;	sval = (SBYTE)val8;	break;
	case VAL_UInt8:		ar << val8; uval = val8; break;
	case VAL_Int16:		ar << val16; sval = (SWORD)val16; break;
	case VAL_UInt16:	ar << val16; uval = val16; break;
	case VAL_Int32:		ar << val32; sval = (SDWORD)val32; break;
	case VAL_UInt32:	ar << val32; uval = val32; break;
	case VAL_Int64:		ar << sval; break;
	case VAL_UInt64:	ar << uval; break;
	case VAL_Float32:	ar << single; sval = (SQWORD)single; break;
	case VAL_Float64:	ar << dbl; sval = (SQWORD)dbl; break;
	default:			SkipValue(ar, tag); return false;		// Incompatible type
	}
	switch (Size)
	{
	case 1:	*(BYTE *)addr = (BYTE)uval; break;
	case 2: *(WORD *)addr = (WORD)uval; break;
	case 4: *(DWORD *)addr = (DWORD)uval; break;
	case 8: *(QWORD *)addr = uval; break;
	}
	return true;
}